

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::DefUseManager::ForEachUse
          (DefUseManager *this,Instruction *def,
          function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *f)

{
  anon_class_8_1_54a39806 local_48;
  function<bool_(spvtools::opt::Instruction_*,_unsigned_int)> local_40;
  function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *local_20;
  function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *f_local;
  Instruction *def_local;
  DefUseManager *this_local;
  
  local_48.f = f;
  local_20 = f;
  f_local = (function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)def;
  def_local = (Instruction *)this;
  std::function<bool(spvtools::opt::Instruction*,unsigned_int)>::
  function<spvtools::opt::analysis::DefUseManager::ForEachUse(spvtools::opt::Instruction_const*,std::function<void(spvtools::opt::Instruction*,unsigned_int)>const&)const::__0,void>
            ((function<bool(spvtools::opt::Instruction*,unsigned_int)> *)&local_40,&local_48);
  WhileEachUse(this,def,&local_40);
  std::function<bool_(spvtools::opt::Instruction_*,_unsigned_int)>::~function(&local_40);
  return;
}

Assistant:

void DefUseManager::ForEachUse(
    const Instruction* def,
    const std::function<void(Instruction*, uint32_t)>& f) const {
  WhileEachUse(def, [&f](Instruction* user, uint32_t index) {
    f(user, index);
    return true;
  });
}